

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PorterTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int flags,char *pText,int nText,
                      _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  PorterContext sCtx;
  void *local_18;
  _func_int_void_ptr_int_char_ptr_int_int_int *local_10;
  Fts5Tokenizer *local_8;
  
  local_8 = pTokenizer + 0x20;
  local_18 = pCtx;
  local_10 = xToken;
  iVar1 = (**(code **)(pTokenizer + 0x10))(*(undefined8 *)(pTokenizer + 0x18),&local_18);
  return iVar1;
}

Assistant:

static int fts5PorterTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int flags,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  PorterTokenizer *p = (PorterTokenizer*)pTokenizer;
  PorterContext sCtx;
  sCtx.xToken = xToken;
  sCtx.pCtx = pCtx;
  sCtx.aBuf = p->aBuf;
  return p->tokenizer.xTokenize(
      p->pTokenizer, (void*)&sCtx, flags, pText, nText, fts5PorterCb
  );
}